

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void do_gvec_shifts(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,
                   TCGv_i32 shift,uint32_t oprsz,uint32_t maxsz,GVecGen2sh_conflict9 *g)

{
  TCGType_conflict TVar1;
  TCGv_vec r;
  TCGTemp *pTVar2;
  TCGTemp *ts;
  TCGTemp *ts_00;
  uint uVar3;
  TCGv_i32 ret;
  int line;
  uint32_t uVar4;
  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_i32_conflict9 *fni;
  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec_conflict9 *fni_00;
  
  TVar1 = choose_vector_type(tcg_ctx,g->s_list,vece,oprsz,vece == 3);
  switch(TVar1) {
  case TCG_TYPE_I32:
    TVar1 = choose_vector_type(tcg_ctx,g->v_list,vece,oprsz,vece == 3);
    if (TVar1 == TCG_TYPE_I32) {
      if (vece == 2) {
        if (oprsz - 4 < 0x10 && (oprsz & 3) == 0) {
          expand_2s_i32(tcg_ctx,dofs,aofs,oprsz,shift,false,g->fni4);
          goto LAB_00d519d8;
        }
LAB_00d51888:
        pTVar2 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
        ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
        ts_00 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
        ret = (TCGv_i32)((long)ts_00 - (long)tcg_ctx);
        tcg_gen_shli_i32_tricore(tcg_ctx,ret,shift,10);
        uVar4 = simd_desc_tricore(oprsz,maxsz,0);
        tcg_gen_ori_i32_tricore(tcg_ctx,ret,ret,uVar4);
        tcg_gen_addi_i64_tricore
                  (tcg_ctx,(TCGv_i64)((long)pTVar2 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
                   (ulong)dofs);
        tcg_gen_addi_i64_tricore
                  (tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
                   (ulong)aofs);
        (*g->fno[vece])(tcg_ctx,(TCGv_ptr)((long)pTVar2 - (long)tcg_ctx),
                        (TCGv_ptr)((long)ts - (long)tcg_ctx),ret);
        tcg_temp_free_internal_tricore(tcg_ctx,pTVar2);
        tcg_temp_free_internal_tricore(tcg_ctx,ts);
        tcg_temp_free_internal_tricore(tcg_ctx,ts_00);
        return;
      }
      if (((oprsz & 7) != 0 || vece != 3) || 0x1f < oprsz - 8) goto LAB_00d51888;
      pTVar2 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
      tcg_gen_extu_i32_i64_tricore(tcg_ctx,(TCGv_i64)((long)pTVar2 - (long)tcg_ctx),shift);
      expand_2s_i64(tcg_ctx,dofs,aofs,oprsz,(TCGv_i64)((long)pTVar2 - (long)tcg_ctx),false,g->fni8);
    }
    else {
      r = tcg_temp_new_vec_tricore(tcg_ctx,TVar1);
      if (vece == 3) {
        pTVar2 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
        tcg_gen_extu_i32_i64_tricore(tcg_ctx,(TCGv_i64)((long)pTVar2 - (long)tcg_ctx),shift);
        tcg_gen_dup_i64_vec_tricore(tcg_ctx,3,r,(TCGv_i64)((long)pTVar2 - (long)tcg_ctx));
        tcg_temp_free_internal_tricore(tcg_ctx,pTVar2);
      }
      else {
        tcg_gen_dup_i32_vec_tricore(tcg_ctx,vece,r,shift);
      }
      if (TVar1 == TCG_TYPE_V64) {
        uVar4 = 8;
        fni_00 = g->fniv_v;
        TVar1 = TCG_TYPE_V64;
LAB_00d519c1:
        expand_2s_vec(tcg_ctx,vece,dofs,aofs,oprsz,uVar4,TVar1,r,false,fni_00);
      }
      else {
        if (TVar1 == TCG_TYPE_V128) {
LAB_00d5199c:
          uVar4 = 0x10;
          fni_00 = g->fniv_v;
          TVar1 = TCG_TYPE_V128;
          goto LAB_00d519c1;
        }
        if (TVar1 != TCG_TYPE_V256) {
          line = 0xace;
          goto LAB_00d51a22;
        }
        uVar3 = oprsz & 0xffffffe0;
        expand_2s_vec(tcg_ctx,vece,dofs,aofs,uVar3,0x20,TCG_TYPE_V256,r,false,g->fniv_v);
        if (uVar3 != oprsz) {
          dofs = dofs + uVar3;
          aofs = aofs + uVar3;
          oprsz = oprsz & 0x1f;
          maxsz = maxsz - uVar3;
          goto LAB_00d5199c;
        }
      }
      pTVar2 = (TCGTemp *)(r + (long)tcg_ctx);
    }
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar2);
    goto LAB_00d519d8;
  default:
    line = 0xaa3;
LAB_00d51a22:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
               ,line,(char *)0x0);
  case TCG_TYPE_V64:
    uVar4 = 8;
    fni = g->fniv_s;
    TVar1 = TCG_TYPE_V64;
    goto LAB_00d51711;
  case TCG_TYPE_V128:
    break;
  case TCG_TYPE_V256:
    uVar3 = oprsz & 0xffffffe0;
    expand_2sh_vec(tcg_ctx,vece,dofs,aofs,uVar3,0x20,TCG_TYPE_V256,shift,g->fniv_s);
    if (uVar3 == oprsz) goto LAB_00d519d8;
    dofs = dofs + uVar3;
    aofs = aofs + uVar3;
    oprsz = oprsz & 0x1f;
    maxsz = maxsz - uVar3;
  }
  uVar4 = 0x10;
  fni = g->fniv_s;
  TVar1 = TCG_TYPE_V128;
LAB_00d51711:
  expand_2sh_vec(tcg_ctx,vece,dofs,aofs,oprsz,uVar4,TVar1,shift,fni);
LAB_00d519d8:
  uVar4 = maxsz - oprsz;
  if (oprsz <= maxsz && uVar4 != 0) {
    do_dup(tcg_ctx,0,dofs + oprsz,uVar4,uVar4,(TCGv_i32)0x0,(TCGv_i64)0x0,0);
  }
  return;
}

Assistant:

static void
do_gvec_shifts(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs, TCGv_i32 shift,
               uint32_t oprsz, uint32_t maxsz, const GVecGen2sh *g)
{
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs);
    check_overlap_2(dofs, aofs, maxsz);

    /* If the backend has a scalar expansion, great.  */
    type = choose_vector_type(tcg_ctx, g->s_list, vece, oprsz, vece == MO_64);
    if (type) {
        const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);
        switch (type) {
        case TCG_TYPE_V256:
            some = QEMU_ALIGN_DOWN(oprsz, 32);
            expand_2sh_vec(tcg_ctx, vece, dofs, aofs, some, 32,
                           TCG_TYPE_V256, shift, g->fniv_s);
            if (some == oprsz) {
                break;
            }
            dofs += some;
            aofs += some;
            oprsz -= some;
            maxsz -= some;
            /* fallthru */
        case TCG_TYPE_V128:
            expand_2sh_vec(tcg_ctx, vece, dofs, aofs, oprsz, 16,
                           TCG_TYPE_V128, shift, g->fniv_s);
            break;
        case TCG_TYPE_V64:
            expand_2sh_vec(tcg_ctx, vece, dofs, aofs, oprsz, 8,
                           TCG_TYPE_V64, shift, g->fniv_s);
            break;
        default:
            g_assert_not_reached();
        }
        tcg_swap_vecop_list(hold_list);
        goto clear_tail;
    }

    /* If the backend supports variable vector shifts, also cool.  */
    type = choose_vector_type(tcg_ctx, g->v_list, vece, oprsz, vece == MO_64);
    if (type) {
        const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);
        TCGv_vec v_shift = tcg_temp_new_vec(tcg_ctx, type);

        if (vece == MO_64) {
            TCGv_i64 sh64 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_extu_i32_i64(tcg_ctx, sh64, shift);
            tcg_gen_dup_i64_vec(tcg_ctx, MO_64, v_shift, sh64);
            tcg_temp_free_i64(tcg_ctx, sh64);
        } else {
            tcg_gen_dup_i32_vec(tcg_ctx, vece, v_shift, shift);
        }

        switch (type) {
        case TCG_TYPE_V256:
            some = QEMU_ALIGN_DOWN(oprsz, 32);
            expand_2s_vec(tcg_ctx, vece, dofs, aofs, some, 32, TCG_TYPE_V256,
                          v_shift, false, g->fniv_v);
            if (some == oprsz) {
                break;
            }
            dofs += some;
            aofs += some;
            oprsz -= some;
            maxsz -= some;
            /* fallthru */
        case TCG_TYPE_V128:
            expand_2s_vec(tcg_ctx, vece, dofs, aofs, oprsz, 16, TCG_TYPE_V128,
                          v_shift, false, g->fniv_v);
            break;
        case TCG_TYPE_V64:
            expand_2s_vec(tcg_ctx, vece, dofs, aofs, oprsz, 8, TCG_TYPE_V64,
                          v_shift, false, g->fniv_v);
            break;
        default:
            g_assert_not_reached();
        }
        tcg_temp_free_vec(tcg_ctx, v_shift);
        tcg_swap_vecop_list(hold_list);
        goto clear_tail;
    }

    /* Otherwise fall back to integral... */
    if (vece == MO_32 && check_size_impl(oprsz, 4)) {
        expand_2s_i32(tcg_ctx, dofs, aofs, oprsz, shift, false, g->fni4);
    } else if (vece == MO_64 && check_size_impl(oprsz, 8)) {
        TCGv_i64 sh64 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64(tcg_ctx, sh64, shift);
        expand_2s_i64(tcg_ctx, dofs, aofs, oprsz, sh64, false, g->fni8);
        tcg_temp_free_i64(tcg_ctx, sh64);
    } else {
        TCGv_ptr a0 = tcg_temp_new_ptr(tcg_ctx);
        TCGv_ptr a1 = tcg_temp_new_ptr(tcg_ctx);
        TCGv_i32 desc = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_shli_i32(tcg_ctx, desc, shift, SIMD_DATA_SHIFT);
        tcg_gen_ori_i32(tcg_ctx, desc, desc, simd_desc(oprsz, maxsz, 0));
        tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, dofs);
        tcg_gen_addi_ptr(tcg_ctx, a1, tcg_ctx->cpu_env, aofs);

        g->fno[vece](tcg_ctx, a0, a1, desc);

        tcg_temp_free_ptr(tcg_ctx, a0);
        tcg_temp_free_ptr(tcg_ctx, a1);
        tcg_temp_free_i32(tcg_ctx, desc);
        return;
    }

 clear_tail:
    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}